

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ExtensionSet::Swap(ExtensionSet *this,ExtensionSet *x)

{
  Arena *pAVar1;
  Arena *pAVar2;
  undefined1 local_50 [8];
  ExtensionSet extension_set;
  ExtensionSet *x_local;
  ExtensionSet *this_local;
  
  extension_set.arena_ = (Arena *)x;
  pAVar1 = GetArenaNoVirtual(this);
  pAVar2 = GetArenaNoVirtual((ExtensionSet *)extension_set.arena_);
  if (pAVar1 == pAVar2) {
    std::
    map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
    ::swap(&this->extensions_,
           (map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
            *)extension_set.arena_);
  }
  else {
    ExtensionSet((ExtensionSet *)local_50);
    MergeFrom((ExtensionSet *)local_50,(ExtensionSet *)extension_set.arena_);
    Clear((ExtensionSet *)extension_set.arena_);
    MergeFrom((ExtensionSet *)extension_set.arena_,this);
    Clear(this);
    MergeFrom(this,(ExtensionSet *)local_50);
    ~ExtensionSet((ExtensionSet *)local_50);
  }
  return;
}

Assistant:

void ExtensionSet::Swap(ExtensionSet* x) {
  if (GetArenaNoVirtual() == x->GetArenaNoVirtual()) {
    extensions_.swap(x->extensions_);
  } else {
    // TODO(cfallin, rohananil): We maybe able to optimize a case where we are
    // swapping from heap to arena-allocated extension set, by just Own()'ing
    // the extensions.
    ExtensionSet extension_set;
    extension_set.MergeFrom(*x);
    x->Clear();
    x->MergeFrom(*this);
    Clear();
    MergeFrom(extension_set);
  }
}